

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::String> __thiscall
kj::AsyncInputStream::readAllText(AsyncInputStream *this,uint64_t limit)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  AllReader *limit_00;
  TransformPromiseNodeBase *pTVar4;
  Disposer *in_RDX;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *pAVar5;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *extraout_RDX;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *extraout_RDX_00;
  AllReader *ptrCopy;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_>_> OVar6;
  Promise<kj::String> PVar7;
  Promise<kj::String> promise;
  undefined1 local_50 [24];
  TransformPromiseNodeBase *local_38;
  Own<kj::(anonymous_namespace)::AllReader> local_30;
  
  limit_00 = (AllReader *)operator_new(0x28);
  limit_00->input = (AsyncInputStream *)limit;
  (limit_00->parts).builder.ptr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  (limit_00->parts).builder.endPtr = (Array<unsigned_char> *)0x0;
  anon_unknown_77::AllReader::loop((AllReader *)local_50,(uint64_t)limit_00);
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,(Own<kj::_::PromiseNode> *)local_50,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:134:29),_kj::_::PropagateException>
             ::anon_class_16_2_f81c8ca8_for_func::operator());
  uVar2 = local_50._8_8_;
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00466bc0;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)limit_00;
  pTVar4[1].dependency.disposer = in_RDX;
  local_50._16_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::AllReader::readAllText(unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_38 = pTVar4;
  if ((Array<unsigned_char> *)local_50._8_8_ != (Array<unsigned_char> *)0x0) {
    local_50._8_8_ = (Array<unsigned_char> *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_50._4_4_,local_50._0_4_))
              ((undefined8 *)CONCAT44(local_50._4_4_,local_50._0_4_),
               (long)(uchar **)uVar2 + *(long *)(*(uchar **)uVar2 + -0x10));
  }
  local_30.disposer = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AllReader>::instance;
  local_30.ptr = limit_00;
  OVar6 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::AllReader>>
                    ((kj *)local_50,(Own<kj::_::PromiseNode> *)(local_50 + 0x10),&local_30);
  pAVar5 = OVar6.ptr;
  uVar1 = local_50._8_4_;
  uVar3 = local_50._12_4_;
  local_50._8_8_ = (Array<unsigned_char> *)0x0;
  *(undefined4 *)&this->_vptr_AsyncInputStream = local_50._0_4_;
  *(undefined4 *)((long)&this->_vptr_AsyncInputStream + 4) = local_50._4_4_;
  *(undefined4 *)&this[1]._vptr_AsyncInputStream = uVar1;
  *(undefined4 *)((long)&this[1]._vptr_AsyncInputStream + 4) = uVar3;
  if (local_30.ptr != (AllReader *)0x0) {
    local_30.ptr = (AllReader *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)();
    pAVar5 = extraout_RDX;
  }
  pTVar4 = local_38;
  if (local_38 != (TransformPromiseNodeBase *)0x0) {
    local_38 = (TransformPromiseNodeBase *)0x0;
    (**(code **)*(uchar **)local_50._16_8_)
              (local_50._16_8_,
               (pTVar4->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar4->super_PromiseNode)._vptr_PromiseNode);
    pAVar5 = extraout_RDX_00;
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pAVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::String>)PVar7.super_PromiseBase.node;
}

Assistant:

Promise<String> AsyncInputStream::readAllText(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllText(limit);
  return promise.attach(kj::mv(reader));
}